

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkImageUtil.cpp
# Opt level: O0

void vk::imageUtilSelfTest(void)

{
  bool bVar1;
  ChannelOrder CVar2;
  deBool dVar3;
  bool local_25;
  TextureFormat TStack_18;
  VkFormat remappedFormat;
  TextureFormat tcuFormat;
  VkFormat format;
  int formatNdx;
  
  for (tcuFormat.type = SNORM_INT8; (int)tcuFormat.type < 0xb9;
      tcuFormat.type = tcuFormat.type + SNORM_INT16) {
    tcuFormat.order = tcuFormat.type;
    if ((((((tcuFormat.type != 0x6e) && (tcuFormat.type != 0x6f)) && (tcuFormat.type != 0x71)) &&
         ((tcuFormat.type != 0x72 && (tcuFormat.type != 0x74)))) &&
        ((tcuFormat.type != 0x75 && ((tcuFormat.type != 0x77 && (tcuFormat.type != 0x78)))))) &&
       ((tcuFormat.type != SNORM_INT8 && (bVar1 = isCompressedFormat(tcuFormat.type), !bVar1)))) {
      TStack_18 = mapVkFormat(tcuFormat.order);
      CVar2 = mapTextureFormat(&stack0xffffffffffffffe8);
      do {
        dVar3 = ::deGetFalse();
        local_25 = false;
        if (dVar3 == 0) {
          local_25 = tcu::isValid(TStack_18);
        }
        if (local_25 == false) {
          deAssertFail("isValid(tcuFormat)",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/framework/vulkan/vkImageUtil.cpp"
                       ,0x2d3);
        }
        dVar3 = ::deGetFalse();
      } while (dVar3 != 0);
      bVar1 = fullTextureFormatRoundTripSupported(tcuFormat.order);
      if (bVar1) {
        do {
          dVar3 = ::deGetFalse();
          if (dVar3 != 0 || tcuFormat.order != CVar2) {
            deAssertFail("format == remappedFormat",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/framework/vulkan/vkImageUtil.cpp"
                         ,0x2d6);
          }
          dVar3 = ::deGetFalse();
        } while (dVar3 != 0);
      }
    }
  }
  return;
}

Assistant:

void imageUtilSelfTest (void)
{
	for (int formatNdx = 0; formatNdx < VK_CORE_FORMAT_LAST; formatNdx++)
	{
		const VkFormat	format	= (VkFormat)formatNdx;

		if (format == VK_FORMAT_R64_UINT			||
			format == VK_FORMAT_R64_SINT			||
			format == VK_FORMAT_R64G64_UINT			||
			format == VK_FORMAT_R64G64_SINT			||
			format == VK_FORMAT_R64G64B64_UINT		||
			format == VK_FORMAT_R64G64B64_SINT		||
			format == VK_FORMAT_R64G64B64A64_UINT	||
			format == VK_FORMAT_R64G64B64A64_SINT)
			continue; // \todo [2015-12-05 pyry] Add framework support for (u)int64 channel type

		if (format != VK_FORMAT_UNDEFINED && !isCompressedFormat(format))
		{
			const tcu::TextureFormat	tcuFormat		= mapVkFormat(format);
			const VkFormat				remappedFormat	= mapTextureFormat(tcuFormat);

			DE_TEST_ASSERT(isValid(tcuFormat));

			if (fullTextureFormatRoundTripSupported(format))
				DE_TEST_ASSERT(format == remappedFormat);
		}
	}
}